

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 242_validAnagrams.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  string s2;
  string s;
  allocator<char> local_89;
  allocator<char> local_88 [32];
  string local_68;
  string local_48;
  string local_28 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_28,"anagram",local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_88,"naagram",&local_89);
  std::__cxx11::string::string((string *)&local_48,local_28);
  std::__cxx11::string::string((string *)&local_68,(string *)local_88);
  isAnagram(&local_48,&local_68);
  poVar1 = std::ostream::_M_insert<bool>(true);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_28);
  return 0;
}

Assistant:

int main()
{
	string s="anagram",s2="naagram";
	cout<<isAnagram(s,s2)<<endl;
	return 0;
}